

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O0

void hdr_iter_linear_init(hdr_iter *iter,hdr_histogram *h,int64_t value_units_per_bucket)

{
  int64_t iVar1;
  int64_t value_units_per_bucket_local;
  hdr_histogram *h_local;
  hdr_iter *iter_local;
  
  hdr_iter_init(iter,h);
  (iter->specifics).percentiles.percentile_to_iterate_to = 0.0;
  (iter->specifics).linear.value_units_per_bucket = value_units_per_bucket;
  (iter->specifics).linear.next_value_reporting_level = value_units_per_bucket;
  iVar1 = lowest_equivalent_value(h,value_units_per_bucket);
  (iter->specifics).linear.next_value_reporting_level_lowest_equivalent = iVar1;
  iter->_next_fp = iter_linear_next;
  return;
}

Assistant:

void hdr_iter_linear_init(struct hdr_iter* iter, const struct hdr_histogram* h, int64_t value_units_per_bucket)
{
    hdr_iter_init(iter, h);

    iter->specifics.linear.count_added_in_this_iteration_step = 0;
    iter->specifics.linear.value_units_per_bucket = value_units_per_bucket;
    iter->specifics.linear.next_value_reporting_level = value_units_per_bucket;
    iter->specifics.linear.next_value_reporting_level_lowest_equivalent = lowest_equivalent_value(h, value_units_per_bucket);

    iter->_next_fp = iter_linear_next;
}